

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O0

Config * __thiscall QPDFJob::AttConfig::endAddAttachment(AttConfig *this)

{
  Config *pCVar1;
  int iVar2;
  ulong uVar3;
  element_type *peVar4;
  QPDFTime *qtm;
  allocator<char> local_a9;
  string local_a8;
  undefined1 local_88 [8];
  string last_element;
  string local_60;
  QUtil local_2c [28];
  AttConfig *local_10;
  AttConfig *this_local;
  
  local_10 = this;
  if ((endAddAttachment()::now_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&endAddAttachment()::now_abi_cxx11_), iVar2 != 0)) {
    QUtil::get_current_qpdf_time();
    QUtil::qpdf_time_to_pdf_time_abi_cxx11_(&endAddAttachment()::now_abi_cxx11_,local_2c,qtm);
    __cxa_atexit(std::__cxx11::string::~string,&endAddAttachment()::now_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&endAddAttachment()::now_abi_cxx11_);
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"add attachment: no file specified",
               (allocator<char> *)(last_element.field_2._M_local_buf + 0xf));
    usage(&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator((allocator<char> *)(last_element.field_2._M_local_buf + 0xf));
  }
  QUtil::path_basename((string *)local_88,&(this->att).path);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"file for --add-attachment may not be empty",&local_a9);
    usage(&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::allocator<char>::~allocator(&local_a9);
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) != 0) {
    std::__cxx11::string::operator=((string *)&(this->att).filename,(string *)local_88);
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) != 0) {
    std::__cxx11::string::operator=((string *)&(this->att).key,(string *)local_88);
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) != 0) {
    std::__cxx11::string::operator=
              ((string *)&(this->att).creationdate,(string *)&endAddAttachment()::now_abi_cxx11_);
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) != 0) {
    std::__cxx11::string::operator=
              ((string *)&(this->att).moddate,(string *)&endAddAttachment()::now_abi_cxx11_);
  }
  peVar4 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this->config->o);
  std::__cxx11::list<QPDFJob::AddAttachment,_std::allocator<QPDFJob::AddAttachment>_>::push_back
            (&peVar4->attachments_to_add,&this->att);
  pCVar1 = this->config;
  std::__cxx11::string::~string((string *)local_88);
  return pCVar1;
}

Assistant:

QPDFJob::Config*
QPDFJob::AttConfig::endAddAttachment()
{
    static std::string now = QUtil::qpdf_time_to_pdf_time(QUtil::get_current_qpdf_time());
    if (this->att.path.empty()) {
        usage("add attachment: no file specified");
    }
    std::string last_element = QUtil::path_basename(this->att.path);
    if (last_element.empty()) {
        usage("file for --add-attachment may not be empty");
    }
    if (this->att.filename.empty()) {
        this->att.filename = last_element;
    }
    if (this->att.key.empty()) {
        this->att.key = last_element;
    }
    if (this->att.creationdate.empty()) {
        this->att.creationdate = now;
    }
    if (this->att.moddate.empty()) {
        this->att.moddate = now;
    }

    this->config->o.m->attachments_to_add.push_back(this->att);
    return this->config;
}